

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  undefined8 *puVar1;
  double dVar2;
  result_type rVar3;
  bool bVar4;
  clock_t cVar5;
  ulong uVar6;
  long *plVar7;
  ostream *poVar8;
  ulong uVar9;
  double *pdVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> observations;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> noisy_observations;
  vector<control_s,_std::allocator<control_s>_> position_meas;
  vector<ground_truth,_std::allocator<ground_truth>_> gt;
  double cum_mean_error [3];
  Map map;
  default_random_engine gen;
  vector<Particle,_std::allocator<Particle>_> particles;
  ParticleFilter pf;
  double total_error [3];
  double sigma_pos [3];
  double sigma_landmark [2];
  ostringstream file;
  undefined1 auStack_4d8 [4];
  int local_4d4;
  result_type local_4d0;
  undefined1 local_4c8 [16];
  ulong local_4b0;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> local_4a8;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> local_488;
  double local_470;
  vector<control_s,_std::allocator<control_s>_> local_468;
  LandmarkObs local_448;
  vector<ground_truth,_std::allocator<ground_truth>_> local_428;
  double local_408 [4];
  Map local_3e8;
  clock_t local_3c8;
  ulong local_3c0;
  double local_3b8;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_3b0;
  vector<Particle,_std::allocator<Particle>_> local_3a8;
  string local_390;
  ParticleFilter local_370;
  double local_338 [4];
  double local_318 [3];
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> local_300;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  double local_288;
  double dStack_280;
  normal_distribution<double> local_278;
  normal_distribution<double> local_258;
  normal_distribution<double> local_238;
  normal_distribution<double> local_218;
  normal_distribution<double> local_1f8;
  double local_1d8 [3];
  Map local_1c0;
  long local_1a8 [2];
  undefined8 auStack_198 [12];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  cVar5 = clock();
  local_318[0] = 0.3;
  local_318[1] = 0.3;
  local_318[2] = 0.01;
  local_1d8[0] = 0.3;
  local_1d8[1] = 0.3;
  local_3b0._M_x = 1;
  local_1f8._M_param._M_mean._0_4_ = 0;
  local_1f8._M_param._M_mean._4_4_ = 0;
  local_1f8._M_param._M_stddev._0_4_ = 0x33333333;
  local_1f8._M_param._M_stddev._4_4_ = 0x3fd33333;
  local_1f8._M_saved = 0.0;
  local_1f8._M_saved_available = false;
  local_218._M_param._M_mean._0_4_ = 0;
  local_218._M_param._M_mean._4_4_ = 0;
  local_218._M_param._M_stddev._0_4_ = 0x33333333;
  local_218._M_param._M_stddev._4_4_ = 0x3fd33333;
  local_218._M_saved = 0.0;
  local_218._M_saved_available = false;
  local_238._M_param._M_mean = 0.0;
  local_238._M_param._M_stddev = 0.01;
  local_238._M_saved = 0.0;
  local_238._M_saved_available = false;
  local_258._M_param._M_mean._0_4_ = 0;
  local_258._M_param._M_mean._4_4_ = 0;
  local_258._M_param._M_stddev._0_4_ = 0x33333333;
  local_258._M_param._M_stddev._4_4_ = 0x3fd33333;
  local_258._M_saved = 0.0;
  local_258._M_saved_available = false;
  local_278._M_param._M_mean._0_4_ = 0;
  local_278._M_param._M_mean._4_4_ = 0;
  local_278._M_param._M_stddev._0_4_ = 0x33333333;
  local_278._M_param._M_stddev._4_4_ = 0x3fd33333;
  local_278._M_saved = 0.0;
  local_278._M_saved_available = false;
  local_3e8.landmark_list.
  super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3e8.landmark_list.
  super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e8.landmark_list.
  super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"data/map_data.txt","");
  bVar4 = read_map_data(&local_2a8,&local_3e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  if (bVar4) {
    local_468.super__Vector_base<control_s,_std::allocator<control_s>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_468.super__Vector_base<control_s,_std::allocator<control_s>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_468.super__Vector_base<control_s,_std::allocator<control_s>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"data/control_data.txt","")
    ;
    bVar4 = read_control_data(&local_2c8,&local_468);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
    if (bVar4) {
      local_428.super__Vector_base<ground_truth,_std::allocator<ground_truth>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_428.super__Vector_base<ground_truth,_std::allocator<ground_truth>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_428.super__Vector_base<ground_truth,_std::allocator<ground_truth>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"data/gt_data.txt","");
      bVar4 = read_gt_data(&local_2e8,&local_428);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p);
      }
      if (bVar4) {
        uVar6 = (ulong)((long)local_468.super__Vector_base<control_s,_std::allocator<control_s>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_468.super__Vector_base<control_s,_std::allocator<control_s>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 4;
        local_370.num_particles = 0;
        local_370.is_initialized = false;
        local_370.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_370.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_370.weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_370.particles.super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_370.particles.super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_370.particles.super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_338[2] = 0.0;
        local_338[0] = 0.0;
        local_338[1] = 0.0;
        local_408[2] = 0.0;
        local_408[0] = 0.0;
        local_408[1] = 0.0;
        local_3c0 = uVar6 & 0xffffffff;
        if ((int)uVar6 < 1) {
          local_3c0 = 0;
        }
        local_4d4 = 0;
        uVar6 = 0;
        local_3c8 = cVar5;
        do {
          if (uVar6 == local_3c0) {
            cVar5 = clock();
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Runtime (sec): ",0xf);
            dVar2 = (double)((int)cVar5 - (int)local_3c8) / 1000000.0;
            local_4c8._0_8_ = dVar2;
            poVar8 = std::ostream::_M_insert<double>(dVar2);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            if (45.0 <= (double)local_4c8._0_8_) {
              if ((local_370.is_initialized & 1U) != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Your runtime ",0xd);
                poVar8 = std::ostream::_M_insert<double>((double)local_4c8._0_8_);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8," is larger than the maximum allowable runtime, ",0x2f);
                poVar8 = std::ostream::_M_insert<double>(45.0);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                std::ostream::put((char)poVar8);
                local_4d4 = -1;
                std::ostream::flush();
                break;
              }
LAB_001042bc:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "This is the starter code. You haven\'t initialized your filter.",0x3e);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
              std::ostream::put('\0');
              std::ostream::flush();
            }
            else {
              if ((local_370.is_initialized & 1U) == 0) goto LAB_001042bc;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Success! Your particle filter passed!",0x25);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            }
            local_4d4 = 0;
            break;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Time step: ",0xb);
          plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar6);
          std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
          std::ostream::put((char)plVar7);
          std::ostream::flush();
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"data/observation/observations_",0x1e);
          lVar13 = *(long *)(local_1a8[0] + -0x18);
          if (acStack_c8[lVar13 + 1] == '\0') {
            std::ios::widen((char)auStack_4d8 + (char)lVar13 + '0');
            acStack_c8[lVar13 + 1] = '\x01';
          }
          acStack_c8[lVar13] = '0';
          *(undefined8 *)((long)auStack_198 + *(long *)(local_1a8[0] + -0x18)) = 6;
          local_4b0 = uVar6 + 1;
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)local_4b0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,".txt",4);
          local_4a8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_4a8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_4a8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::stringbuf::str();
          bVar4 = read_landmark_data(&local_390,&local_4a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390._M_dataplus._M_p != &local_390.field_2) {
            operator_delete(local_390._M_dataplus._M_p);
          }
          if (bVar4) {
            if (local_370.is_initialized == false) {
              rVar3 = std::normal_distribution<double>::operator()
                                (&local_1f8,&local_3b0,&local_1f8._M_param);
              local_4c8._0_8_ = rVar3;
              local_4d0 = std::normal_distribution<double>::operator()
                                    (&local_218,&local_3b0,&local_218._M_param);
              std::normal_distribution<double>::operator()
                        (&local_238,&local_3b0,&local_238._M_param);
              ParticleFilter::init(&local_370,(EVP_PKEY_CTX *)local_318);
            }
            else {
              ParticleFilter::prediction
                        (&local_370,0.1,local_318,
                         local_468.super__Vector_base<control_s,_std::allocator<control_s>_>._M_impl
                         .super__Vector_impl_data._M_start[uVar6 - 1].velocity,
                         local_468.super__Vector_base<control_s,_std::allocator<control_s>_>._M_impl
                         .super__Vector_impl_data._M_start[uVar6 - 1].yawrate);
            }
            local_488.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_488.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
            super__Vector_impl_data._M_finish = (LandmarkObs *)0x0;
            local_488.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (LandmarkObs *)0x0;
            if (local_4a8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_4a8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                super__Vector_impl_data._M_start) {
              lVar13 = 0;
              uVar14 = 0;
              do {
                rVar3 = std::normal_distribution<double>::operator()
                                  (&local_258,&local_3b0,&local_258._M_param);
                local_4c8._8_4_ = extraout_XMM0_Dc;
                local_4c8._0_8_ = rVar3;
                local_4c8._12_4_ = extraout_XMM0_Dd;
                rVar3 = std::normal_distribution<double>::operator()
                                  (&local_278,&local_3b0,&local_278._M_param);
                puVar1 = (undefined8 *)
                         ((long)&(local_4a8.
                                  super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->id + lVar13);
                local_448._0_8_ = *puVar1;
                local_448.x = (double)local_4c8._0_8_ + (double)puVar1[1];
                local_448.y = rVar3 + *(double *)
                                       ((long)&(local_4a8.
                                                super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->y +
                                       lVar13);
                if (local_488.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_488.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<LandmarkObs,std::allocator<LandmarkObs>>::
                  _M_realloc_insert<LandmarkObs_const&>
                            ((vector<LandmarkObs,std::allocator<LandmarkObs>> *)&local_488,
                             (iterator)
                             local_488.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>
                             ._M_impl.super__Vector_impl_data._M_finish,&local_448);
                }
                else {
                  (local_488.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                   super__Vector_impl_data._M_finish)->y = local_448.y;
                  (local_488.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                   super__Vector_impl_data._M_finish)->id = local_448.id;
                  *(int *)&(local_488.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>.
                            _M_impl.super__Vector_impl_data._M_finish)->field_0x4 = local_448._4_4_;
                  (local_488.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                   super__Vector_impl_data._M_finish)->x = local_448.x;
                  local_488.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_488.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                uVar14 = uVar14 + 1;
                uVar9 = ((long)local_4a8.
                               super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                         (long)local_4a8.
                               super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl
                               .super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
                lVar13 = lVar13 + 0x18;
              } while (uVar14 <= uVar9 && uVar9 - uVar14 != 0);
            }
            std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::vector(&local_300,&local_488);
            std::vector<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>::vector
                      (&local_1c0.landmark_list,&local_3e8.landmark_list);
            ParticleFilter::updateWeights(&local_370,50.0,local_1d8,&local_300,&local_1c0);
            if (local_1c0.landmark_list.
                super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_1c0.landmark_list.
                              super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_300.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_300.
                              super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            ParticleFilter::resample(&local_370);
            std::vector<Particle,_std::allocator<Particle>_>::vector
                      (&local_3a8,&local_370.particles);
            uVar11 = (int)((long)local_3a8.super__Vector_base<Particle,_std::allocator<Particle>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_3a8.super__Vector_base<Particle,_std::allocator<Particle>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3) * -0x33333333;
            if (0 < (int)uVar11) {
              uVar14 = (ulong)(uVar11 & 0x7fffffff);
              pdVar10 = &(local_3a8.super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
                          super__Vector_impl_data._M_start)->weight;
              uVar15 = 0;
              uVar16 = 0;
              do {
                dVar2 = *pdVar10;
                if ((double)CONCAT44(uVar16,uVar15) <= dVar2 &&
                    dVar2 != (double)CONCAT44(uVar16,uVar15)) {
                  local_288 = pdVar10[-3];
                  dStack_280 = pdVar10[-2];
                  local_3b8 = pdVar10[-1];
                  uVar15 = SUB84(dVar2,0);
                  uVar16 = (int)((ulong)dVar2 >> 0x20);
                }
                pdVar10 = pdVar10 + 5;
                uVar14 = uVar14 - 1;
              } while (uVar14 != 0);
            }
            dVar2 = ABS(dStack_280 -
                        local_428.super__Vector_base<ground_truth,_std::allocator<ground_truth>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar6].y);
            unique0x10000c96 = SUB84(dVar2,0);
            getError(double,double,double,double,double,double)::error =
                 ABS(local_288 -
                     local_428.super__Vector_base<ground_truth,_std::allocator<ground_truth>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar6].x);
            unique0x10000c9a = (int)((ulong)dVar2 >> 0x20);
            dVar2 = fmod(ABS(local_3b8 -
                             local_428.
                             super__Vector_base<ground_truth,_std::allocator<ground_truth>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar6].theta),6.283185307179586);
            _DAT_0010a1d0 =
                 ~-(ulong)(3.141592653589793 < dVar2) & (ulong)dVar2 |
                 (ulong)(6.283185307179586 - dVar2) & -(ulong)(3.141592653589793 < dVar2);
            lVar13 = 0;
            do {
              dVar2 = *(double *)
                       ((long)&getError(double,double,double,double,double,double)::error + lVar13)
                      + *(double *)((long)local_338 + lVar13);
              *(double *)((long)local_338 + lVar13) = dVar2;
              *(double *)((long)local_408 + lVar13) = dVar2 / (double)(int)local_4b0;
              lVar13 = lVar13 + 8;
            } while (lVar13 != 0x18);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Cumulative mean weighted error: x ",0x22);
            local_4c8._0_8_ = local_408[0];
            poVar8 = std::ostream::_M_insert<double>(local_408[0]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," y ",3);
            local_4d0 = local_408[1];
            poVar8 = std::ostream::_M_insert<double>(local_408[1]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," yaw ",5);
            local_470 = local_408[2];
            poVar8 = std::ostream::_M_insert<double>(local_408[2]);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            bVar4 = true;
            if ((99 < uVar6) &&
               (((1.0 < (double)local_4c8._0_8_ || (1.0 < local_4d0)) || (0.05 < local_470)))) {
              if ((double)local_4c8._0_8_ <= 1.0) {
                if (local_4d0 <= 1.0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Your yaw error, ",0x10);
                  poVar8 = std::ostream::_M_insert<double>(local_470);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar8," is larger than the maximum allowable error, ",0x2d);
                  poVar8 = std::ostream::_M_insert<double>(0.05);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"Your y error, ",0xe);
                  poVar8 = std::ostream::_M_insert<double>(local_4d0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar8," is larger than the maximum allowable error, ",0x2d);
                  poVar8 = std::ostream::_M_insert<double>(1.0);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Your x error, ",0xe);
                poVar8 = std::ostream::_M_insert<double>((double)local_4c8._0_8_);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8," is larger than the maximum allowable error, ",0x2d);
                poVar8 = std::ostream::_M_insert<double>(1.0);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
              }
              std::ostream::put((char)poVar8);
              std::ostream::flush();
              local_4d4 = -1;
              bVar4 = false;
            }
            if (local_3a8.super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_3a8.super__Vector_base<Particle,_std::allocator<Particle>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_488.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_488.
                              super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Error: Could not open observation file ",0x27);
            plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)local_4b0);
            std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
            std::ostream::put((char)plVar7);
            std::ostream::flush();
            local_4d4 = -1;
            bVar4 = false;
          }
          if (local_4a8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_4a8.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          uVar6 = local_4b0;
        } while (bVar4);
        ParticleFilter::~ParticleFilter(&local_370);
        iVar12 = local_4d4;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Error: Could not open ground truth data file",0x2c);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
        std::ostream::put('\0');
        iVar12 = -1;
        std::ostream::flush();
      }
      if (local_428.super__Vector_base<ground_truth,_std::allocator<ground_truth>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_428.super__Vector_base<ground_truth,_std::allocator<ground_truth>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error: Could not open position/control measurement file",
                 0x37);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
      std::ostream::put('\0');
      iVar12 = -1;
      std::ostream::flush();
    }
    if (local_468.super__Vector_base<control_s,_std::allocator<control_s>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_468.super__Vector_base<control_s,_std::allocator<control_s>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error: Could not open map file",0x1e);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    iVar12 = -1;
    std::ostream::flush();
  }
  if (local_3e8.landmark_list.
      super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3e8.landmark_list.
                    super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar12;
}

Assistant:

int main() {
	
	// parameters related to grading.
	int time_steps_before_lock_required = 100; // number of time steps before accuracy is checked by grader.
	double max_runtime = 45; // Max allowable runtime to pass [sec]
	double max_translation_error = 1; // Max allowable translation error to pass [m]
	double max_yaw_error = 0.05; // Max allowable yaw error [rad]



	// Start timer.
	int start = clock();
	
	//Set up parameters here
	double delta_t = 0.1; // Time elapsed between measurements [sec]
	double sensor_range = 50; // Sensor range [m]
	
	/*
	 * Sigmas - just an estimate, usually comes from uncertainty of sensor, but
	 * if you used fused data from multiple sensors, it's difficult to find
	 * these uncertainties directly.
	 */
	double sigma_pos [3] = {0.3, 0.3, 0.01}; // GPS measurement uncertainty [x [m], y [m], theta [rad]]
	double sigma_landmark [2] = {0.3, 0.3}; // Landmark measurement uncertainty [x [m], y [m]]

	// noise generation
	default_random_engine gen;
	normal_distribution<double> N_x_init(0, sigma_pos[0]);
	normal_distribution<double> N_y_init(0, sigma_pos[1]);
	normal_distribution<double> N_theta_init(0, sigma_pos[2]);
	normal_distribution<double> N_obs_x(0, sigma_landmark[0]);
	normal_distribution<double> N_obs_y(0, sigma_landmark[1]);
	double n_x, n_y, n_theta, n_range, n_heading;
	// Read map data
	Map map;
	if (!read_map_data("data/map_data.txt", map)) {
		cout << "Error: Could not open map file" << endl;
		return -1;
	}

	// Read position data
	vector<control_s> position_meas;
	if (!read_control_data("data/control_data.txt", position_meas)) {
		cout << "Error: Could not open position/control measurement file" << endl;
		return -1;
	}
	
	// Read ground truth data
	vector<ground_truth> gt;
	if (!read_gt_data("data/gt_data.txt", gt)) {
		cout << "Error: Could not open ground truth data file" << endl;
		return -1;
	}
	
	// Run particle filter!
	int num_time_steps = position_meas.size();
	ParticleFilter pf;
	double total_error[3] = {0,0,0};
	double cum_mean_error[3] = {0,0,0};
	
	for (int i = 0; i < num_time_steps; ++i) {
		cout << "Time step: " << i << endl;
		// Read in landmark observations for current time step.
		ostringstream file;
		file << "data/observation/observations_" << setfill('0') << setw(6) << i+1 << ".txt";
		vector<LandmarkObs> observations;
		if (!read_landmark_data(file.str(), observations)) {
			cout << "Error: Could not open observation file " << i+1 << endl;
			return -1;
		}
		
		// Initialize particle filter if this is the first time step.
		if (!pf.initialized()) {
			n_x = N_x_init(gen);
			n_y = N_y_init(gen);
			n_theta = N_theta_init(gen);
			pf.init(gt[i].x + n_x, gt[i].y + n_y, gt[i].theta + n_theta, sigma_pos);
		}
		else {
			// Predict the vehicle's next state (noiseless).
			pf.prediction(delta_t, sigma_pos, position_meas[i-1].velocity, position_meas[i-1].yawrate);
		}
		// simulate the addition of noise to noiseless observation data.
		vector<LandmarkObs> noisy_observations;
		LandmarkObs obs;
		for (int j = 0; j < observations.size(); ++j) {
			n_x = N_obs_x(gen);
			n_y = N_obs_y(gen);
			obs = observations[j];
			obs.x = obs.x + n_x;
			obs.y = obs.y + n_y;
			noisy_observations.push_back(obs);
		}

		// Update the weights and resample
		pf.updateWeights(sensor_range, sigma_landmark, noisy_observations, map);
		pf.resample();
		
		// Calculate and output the average weighted error of the particle filter over all time steps so far.
		vector<Particle> particles = pf.particles;
		int num_particles = particles.size();
		double highest_weight = 0.0;
		Particle best_particle;
		for (int i = 0; i < num_particles; ++i) {
			if (particles[i].weight > highest_weight) {
				highest_weight = particles[i].weight;
				best_particle = particles[i];
			}
		}
		double *avg_error = getError(gt[i].x, gt[i].y, gt[i].theta, best_particle.x, best_particle.y, best_particle.theta);

		for (int j = 0; j < 3; ++j) {
			total_error[j] += avg_error[j];
			cum_mean_error[j] = total_error[j] / (double)(i + 1);
		}
		
		// Print the cumulative weighted error
		cout << "Cumulative mean weighted error: x " << cum_mean_error[0] << " y " << cum_mean_error[1] << " yaw " << cum_mean_error[2] << endl;
		
		// If the error is too high, say so and then exit.
		if (i >= time_steps_before_lock_required) {
			if (cum_mean_error[0] > max_translation_error || cum_mean_error[1] > max_translation_error || cum_mean_error[2] > max_yaw_error) {
				if (cum_mean_error[0] > max_translation_error) {
					cout << "Your x error, " << cum_mean_error[0] << " is larger than the maximum allowable error, " << max_translation_error << endl;
				}
				else if (cum_mean_error[1] > max_translation_error) {
					cout << "Your y error, " << cum_mean_error[1] << " is larger than the maximum allowable error, " << max_translation_error << endl;
				}
				else {
					cout << "Your yaw error, " << cum_mean_error[2] << " is larger than the maximum allowable error, " << max_yaw_error << endl;
				}
				return -1;
			}
		}
	}
	
	// Output the runtime for the filter.
	int stop = clock();
	double runtime = (stop - start) / double(CLOCKS_PER_SEC);
	cout << "Runtime (sec): " << runtime << endl;
	
	// Print success if accuracy and runtime are sufficient (and this isn't just the starter code).
	if (runtime < max_runtime && pf.initialized()) {
		cout << "Success! Your particle filter passed!" << endl;
	}
	else if (!pf.initialized()) {
		cout << "This is the starter code. You haven't initialized your filter." << endl;
	}
	else {
		cout << "Your runtime " << runtime << " is larger than the maximum allowable runtime, " << max_runtime << endl;
		return -1;
	}
	
	return 0;
}